

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

void Au_ManCountThings(Au_Man_t *p)

{
  double dVar1;
  uint uVar2;
  Au_Ntk_t *p_00;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  Au_Ntk_t *pAVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  
  lVar13 = (long)(p->vNtks).nSize;
  if (1 < lVar13) {
    do {
      if ((p->vNtks).nSize < lVar13) goto LAB_008503bb;
      p_00 = (Au_Ntk_t *)(p->vNtks).pArray[lVar13 + -1];
      p_00->nBoxes = (double)p_00->nObjs[6];
      p_00->nNodes = (double)p_00->nObjs[7];
      p_00->nPorts = (double)(p_00->nObjs[3] + p_00->nObjs[2]);
      iVar8 = Au_NtkNodeNumFunc(p_00,1);
      p_00->nNodeAnds = (double)iVar8;
      iVar8 = Au_NtkNodeNumFunc(p_00,2);
      p_00->nNodeXors = (double)iVar8;
      iVar8 = Au_NtkNodeNumFunc(p_00,3);
      p_00->nNodeMuxs = (double)iVar8;
      uVar9 = (ulong)(p_00->vObjs).nSize;
      if (0 < (long)uVar9) {
        uVar2 = (p_00->vObjs).nSize;
        uVar10 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar10 = 0;
        }
        uVar11 = 0;
        do {
          if (uVar10 == uVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar2 = (p_00->vObjs).pArray[uVar11];
          pvVar3 = (p_00->vPages).pArray[(int)uVar2 >> 0xc];
          uVar12 = (ulong)((uVar2 & 0xfff) << 4);
          uVar4 = *(ulong *)((long)pvVar3 + uVar12);
          if ((uVar4 & 0x700000000) == 0x600000000) {
            uVar12 = (long)pvVar3 + uVar12;
            lVar5 = *(long *)(*(long *)(uVar12 & 0xfffffffffffffc00) + 8);
            if (*(int *)(lVar5 + 0xc) <= (int)((uint)uVar4 & 0x3fffffff)) goto LAB_008503bb;
            pAVar6 = *(Au_Ntk_t **)(*(long *)(lVar5 + 0x10) + (ulong)((uint)uVar4 & 0x3fffffff) * 8)
            ;
            if ((pAVar6 != (Au_Ntk_t *)0x0) && (pAVar6 != p_00)) {
              if (pAVar6->nObjs[2] != (uint)(uVar4 >> 0x23)) {
                __assert_fail("Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                              ,0x200,"void Au_ManCountThings(Au_Man_t *)");
              }
              if (*(int *)(uVar12 + 8 + (uVar4 >> 0x23) * 4) != pAVar6->nObjs[3]) {
                __assert_fail("Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                              ,0x201,"void Au_ManCountThings(Au_Man_t *)");
              }
              if (pAVar6->Id <= p_00->Id) {
                __assert_fail("pBoxModel->Id > pNtk->Id",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                              ,0x202,"void Au_ManCountThings(Au_Man_t *)");
              }
              dVar1 = pAVar6->nPorts;
              if (dVar1 <= 0.0) {
                __assert_fail("pBoxModel->nPorts > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                              ,0x203,"void Au_ManCountThings(Au_Man_t *)");
              }
              p_00->nBoxes = pAVar6->nBoxes + p_00->nBoxes;
              p_00->nNodes = pAVar6->nNodes + p_00->nNodes;
              p_00->nPorts = dVar1 + p_00->nPorts;
              p_00->nNodeAnds = pAVar6->nNodeAnds + p_00->nNodeAnds;
              p_00->nNodeXors = pAVar6->nNodeXors + p_00->nNodeXors;
              p_00->nNodeMuxs = pAVar6->nNodeMuxs + p_00->nNodeMuxs;
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      bVar7 = 2 < lVar13;
      lVar13 = lVar13 + -1;
    } while (bVar7);
  }
  if (1 < (p->vNtks).nSize) {
    pvVar3 = (p->vNtks).pArray[1];
    printf("Total nodes = %15.0f. Total instances = %15.0f. Total ports = %15.0f.\n",
           *(undefined8 *)((long)pvVar3 + 0xd8),*(undefined8 *)((long)pvVar3 + 0xd0),
           *(undefined8 *)((long)pvVar3 + 0xe0));
    printf("Total ANDs  = %15.0f.\n",*(undefined8 *)((long)pvVar3 + 0xe8));
    printf("Total XORs  = %15.0f.\n",*(undefined8 *)((long)pvVar3 + 0xf0));
    printf("Total MUXes = %15.0f.\n",*(undefined8 *)((long)pvVar3 + 0xf8));
    return;
  }
LAB_008503bb:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Au_ManCountThings( Au_Man_t * p )
{
    Au_Ntk_t * pNtk, * pBoxModel;
    Au_Obj_t * pBox;
    int i, k;//, clk = Abc_Clock();
    Au_ManForEachNtkReverse( p, pNtk, i )
    {
        pNtk->nBoxes = Au_NtkBoxNum(pNtk);
        pNtk->nNodes = Au_NtkNodeNum(pNtk);
        pNtk->nPorts = Au_NtkPiNum(pNtk) + Au_NtkPoNum(pNtk);
        pNtk->nNodeAnds = Au_NtkNodeNumFunc( pNtk, 1 );
        pNtk->nNodeXors = Au_NtkNodeNumFunc( pNtk, 2 );
        pNtk->nNodeMuxs = Au_NtkNodeNumFunc( pNtk, 3 );
//        assert( pNtk->nNodes == pNtk->nNodeAnds + pNtk->nNodeXors + pNtk->nNodeMuxs );
//        printf( "adding %.0f nodes of model %s\n", pNtk->nNodes, Au_NtkName(pNtk) );
        Au_NtkForEachBox( pNtk, pBox, k )
        {
            pBoxModel = Au_ObjModel(pBox);
            if ( pBoxModel == NULL || pBoxModel == pNtk )
                continue;
            assert( Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel) );
            assert( Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel) );
            assert( pBoxModel->Id > pNtk->Id );
            assert( pBoxModel->nPorts > 0 );
            pNtk->nBoxes += pBoxModel->nBoxes;
            pNtk->nNodes += pBoxModel->nNodes;
            pNtk->nPorts += pBoxModel->nPorts;
            pNtk->nNodeAnds += pBoxModel->nNodeAnds;
            pNtk->nNodeXors += pBoxModel->nNodeXors;
            pNtk->nNodeMuxs += pBoxModel->nNodeMuxs;
//            printf( "    adding %.0f nodes of model %s\n", pBoxModel->nNodes, Au_NtkName(pBoxModel) );
        }
//        printf( "total %.0f nodes in model %s\n", pNtk->nNodes, Au_NtkName(pNtk) );
    }
    pNtk = Au_ManNtkRoot(p);
    printf( "Total nodes = %15.0f. Total instances = %15.0f. Total ports = %15.0f.\n", 
//    printf( "Total nodes = %.2e. Total instances = %.2e. Total ports = %.2e.\n", 
        pNtk->nNodes, pNtk->nBoxes, pNtk->nPorts );
//    printf( "Total ANDs  = %15.0f. Total XORs      = %15.0f. Total MUXes = %15.0f.\n", 
//    printf( "Total ANDs  = %.2e. Total XORs      = %.2e. Total MUXes = %.2e.  ", 
//        pNtk->nNodeAnds, pNtk->nNodeXors, pNtk->nNodeMuxs );
    printf( "Total ANDs  = %15.0f.\n", pNtk->nNodeAnds );
    printf( "Total XORs  = %15.0f.\n", pNtk->nNodeXors );
    printf( "Total MUXes = %15.0f.\n", pNtk->nNodeMuxs );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}